

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<35UL> * __thiscall
mserialize::cx_strcat<1ul,33ul,1ul>
          (cx_string<35UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<33UL> *strings_1,cx_string<1UL> *strings_2)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong auStack_68 [5];
  mserialize *local_40;
  cx_string<1UL> *local_38;
  cx_string<33UL> *local_30;
  char buffer [36];
  
  pcVar3 = buffer;
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x1f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  local_40 = this;
  local_38 = strings;
  local_30 = strings_1;
  lVar1 = 1;
  auStack_68[1] = 1;
  auStack_68[2] = 0x21;
  auStack_68[3] = 1;
  do {
    if (auStack_68[lVar1] != 0) {
      uVar2 = 0;
      do {
        pcVar3[uVar2] = *(char *)(auStack_68[lVar1 + 4] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_68[lVar1]);
      pcVar3 = pcVar3 + uVar2;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  __return_storage_ptr__->_data[0x23] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = buffer._0_8_;
  *(undefined8 *)(__return_storage_ptr__->_data + 8) = buffer._8_8_;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x10) = buffer._16_8_;
  *(ulong *)(__return_storage_ptr__->_data + 0x18) = CONCAT17(buffer[0x1f],buffer._24_7_);
  *(undefined4 *)(__return_storage_ptr__->_data + 0x1f) = buffer._31_4_;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}